

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmmain.cpp
# Opt level: O0

int vm_get_game_type(char *filename,char *actual_fname,size_t actual_fname_len,char **defexts,
                    size_t defext_count)

{
  int iVar1;
  size_t in_RDX;
  char *in_RSI;
  char *in_RDI;
  ulong in_R8;
  char cur_fname [4096];
  int cur_ver;
  size_t i;
  int last_good_ver;
  int good_count;
  char acStackY_1048 [16];
  char *in_stack_ffffffffffffefc8;
  char *in_stack_ffffffffffffefd0;
  char *in_stack_ffffffffffffefd8;
  ulong local_40;
  int local_38;
  int local_34;
  int local_4;
  
  iVar1 = access(in_RDI,0);
  if (iVar1 == 0) {
    if (in_RDX != 0) {
      strncpy(in_RSI,in_RDI,in_RDX);
      in_RSI[in_RDX - 1] = '\0';
    }
    local_4 = vm_get_game_type_for_file(in_stack_ffffffffffffefd8);
  }
  else {
    local_34 = 0;
    for (local_40 = 0; local_40 < in_R8; local_40 = local_40 + 1) {
      strcpy(acStackY_1048,in_RDI);
      os_defext(in_stack_ffffffffffffefd0,in_stack_ffffffffffffefc8);
      iVar1 = vm_get_game_type_for_file(in_stack_ffffffffffffefd8);
      if ((0 < iVar1) && (local_34 = local_34 + 1, local_38 = iVar1, in_RDX != 0)) {
        strncpy(in_RSI,acStackY_1048,in_RDX);
        in_RSI[in_RDX - 1] = '\0';
      }
    }
    if (local_34 == 1) {
      local_4 = local_38;
    }
    else if (local_34 == 0) {
      local_4 = -1;
    }
    else {
      local_4 = -3;
    }
  }
  return local_4;
}

Assistant:

int vm_get_game_type(const char *filename,
                     char *actual_fname, size_t actual_fname_len,
                     const char *const *defexts, size_t defext_count)
{
    int good_count;
    int last_good_ver;
    size_t i;

    /* 
     *   If the exact filename as given exists, determine the file type
     *   directly from this file without trying any default extensions.
     */
    if (osfacc(filename) == 0)
    {
        /* the actual filename is exactly what we were given */
        if (actual_fname_len != 0)
        {
            /* copy the filename, limiting it to the buffer length */
            strncpy(actual_fname, filename, actual_fname_len);
            actual_fname[actual_fname_len - 1] = '\0';
        }

        /* return the type according to the file's signature */
        return vm_get_game_type_for_file(filename);
    }
    
    /* presume we won't find any good files using default extensions */
    good_count = 0;

    /* try each default extension supplied */
    for (i = 0 ; i < defext_count ; ++i)
    {
        int cur_ver;
        char cur_fname[OSFNMAX];

        /* 
         *   build the default filename from the given filename and the
         *   current default suffix 
         */
        strcpy(cur_fname, filename);
        os_defext(cur_fname, defexts[i]);

        /* get the version for this file */
        cur_ver = vm_get_game_type_for_file(cur_fname);
        
        /* if it's a valid code, note it and remember it */
        if (vm_ggt_is_valid(cur_ver))
        {
            /* it's a valid file - count it */
            ++good_count;

            /* remember its version as the last good file's version */
            last_good_ver = cur_ver;

            /* remember its name as the last good file's name */
            if (actual_fname_len != 0)
            {
                /* copy the filename, limiting it to the buffer length */
                strncpy(actual_fname, cur_fname, actual_fname_len);
                actual_fname[actual_fname_len - 1] = '\0';
            }
        }
    }

    /*
     *   If we had exactly one good match, return it.  We will already have
     *   filled in actual_fname with the last good filename, so all we need
     *   to do in this case is return the version ID for the last good file. 
     */
    if (good_count == 1)
        return last_good_ver;

    /*
     *   If we didn't find any matches, tell the caller there is no match
     *   for the given filename. 
     */
    if (good_count == 0)
        return VM_GGT_NOT_FOUND;

    /* we found more than one match, so the type is ambiguous */
    return VM_GGT_AMBIG;
}